

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O2

void __thiscall UnitTest_semantic10::Run(UnitTest_semantic10 *this)

{
  allocator local_51;
  long *local_50;
  string local_48;
  long *local_28;
  long *local_20;
  
  std::__cxx11::string::string((string *)&local_48,"a = 1 > 2",&local_51);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_50,&local_48);
  if (local_50 == (long *)0x0) {
    local_50 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string
              ((string *)&local_48,"\'Semantic(\"a = 1 > 2\")\'",(allocator *)&local_50);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
  }
  else {
    (**(code **)(*local_50 + 8))();
    local_50 = (long *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"a = \'str\' >= \'str\'",&local_51);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_50,&local_48);
  if (local_50 == (long *)0x0) {
    local_50 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string
              ((string *)&local_48,"\'Semantic(\"a = \'str\' >= \'str\'\")\'",(allocator *)&local_50
              );
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
  }
  else {
    (**(code **)(*local_50 + 8))();
    local_50 = (long *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"a = 1 > b",&local_51);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_50,&local_48);
  if (local_50 == (long *)0x0) {
    local_50 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string
              ((string *)&local_48,"\'Semantic(\"a = 1 > b\")\'",(allocator *)&local_50);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
  }
  else {
    (**(code **)(*local_50 + 8))();
    local_50 = (long *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"a = 1 < \'str\'",(allocator *)&local_50);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_20,&local_48);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  local_20 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string
            ((string *)&local_48,
             "\'{ Semantic(\"a = 1 < \'str\'\"); }\' has no luna::SemanticException",
             (allocator *)&local_50);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"a = true <= false",(allocator *)&local_50);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_28,&local_48);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  local_28 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string
            ((string *)&local_48,
             "\'{ Semantic(\"a = true <= false\"); }\' has no luna::SemanticException",
             (allocator *)&local_50);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

TEST_CASE(semantic10)
{
    EXPECT_TRUE(Semantic("a = 1 > 2"));
    EXPECT_TRUE(Semantic("a = 'str' >= 'str'"));
    EXPECT_TRUE(Semantic("a = 1 > b"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = 1 < 'str'");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = true <= false");
    });
}